

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_inc_helper_unpolar<ExchCXX::BuiltinR2SCANL_C>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  ulong uVar1;
  double sigma_00;
  double tau_00;
  double rho_00;
  double e;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (0 < N) {
    uVar1 = 0;
    local_48 = scal_fact;
    do {
      rho_00 = rho[uVar1];
      local_38 = lapl[uVar1];
      local_40 = 1.0000000000000052e-40;
      if (1.0000000000000052e-40 <= sigma[uVar1]) {
        local_40 = sigma[uVar1];
      }
      if (rho_00 <= 1e-15) {
        local_60 = 0.0;
      }
      else {
        local_50 = rho_00;
        kernel_traits<ExchCXX::BuiltinPC07OPT_K>::eval_exc_unpolar_impl
                  (rho_00,local_40,local_38,0.0,&local_60);
        rho_00 = local_50;
      }
      local_60 = local_60 * rho_00;
      if (rho_00 <= 1e-15) {
        local_58 = 0.0;
      }
      else {
        tau_00 = 1e-20;
        if (1e-20 <= local_60) {
          tau_00 = local_60;
        }
        sigma_00 = rho_00 * 8.0 * tau_00;
        if (local_40 <= sigma_00) {
          sigma_00 = local_40;
        }
        kernel_traits<ExchCXX::BuiltinR2SCAN_C>::eval_exc_unpolar_impl
                  (rho_00,sigma_00,local_38,tau_00,&local_58);
      }
      eps[uVar1] = local_58 * local_48 + eps[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

MGGA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    double e;
    const double lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    traits::eval_exc_unpolar( rho[i], sigma[i], lapl_i, tau[i], e );
    eps[i] += scal_fact * e;

  }

}